

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypt.c
# Opt level: O1

void gen_e(uchar *e)

{
  long lVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  undefined1 auVar9 [14];
  long lVar10;
  int iVar11;
  long lVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  char cVar19;
  ushort uVar20;
  char cVar25;
  ushort uVar26;
  char cVar28;
  ushort uVar29;
  char cVar31;
  ushort uVar32;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  undefined1 auVar21 [16];
  char cVar24;
  char cVar27;
  char cVar30;
  char cVar33;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar38 [16];
  ulong uVar39;
  undefined1 auVar40 [16];
  uchar val [64];
  uint16_t ind [128];
  uint16_t ind_ [128];
  ulong local_258 [8];
  ushort auStack_218 [128];
  uint local_118 [64];
  
  do {
    do {
      randombytes((uchar *)local_118,0x100);
      lVar10 = 0;
      do {
        lVar12 = lVar10 * 2;
        uVar5 = *(uint *)((long)local_118 + lVar12 + 4);
        uVar6 = *(uint *)((long)local_118 + lVar12 + 8);
        uVar7 = *(uint *)((long)local_118 + lVar12 + 0xc);
        lVar1 = lVar10 * 2;
        *(uint *)((long)local_118 + lVar1) = *(uint *)((long)local_118 + lVar12) & 0xfff0fff;
        *(uint *)((long)local_118 + lVar1 + 4) = uVar5 & 0xfff0fff;
        *(uint *)((long)local_118 + lVar1 + 8) = uVar6 & 0xfff0fff;
        *(uint *)((long)local_118 + lVar1 + 0xc) = uVar7 & 0xfff0fff;
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x80);
      lVar10 = 0;
      iVar11 = 0;
      do {
        uVar20 = *(ushort *)((long)local_118 + lVar10 * 2);
        if (uVar20 < 0xda0) {
          lVar12 = (long)iVar11;
          iVar11 = iVar11 + 1;
          auStack_218[lVar12] = uVar20;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x80);
    } while (iVar11 < 0x40);
    bVar8 = false;
    lVar10 = 1;
    do {
      lVar12 = 0;
      do {
        if (auStack_218[lVar10] == auStack_218[lVar12]) {
          bVar8 = true;
        }
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
  } while (bVar8);
  lVar10 = 0;
  do {
    uVar20 = auStack_218[lVar10] & 0xff;
    uVar26 = auStack_218[lVar10 + 1] & 0xff;
    uVar29 = auStack_218[lVar10 + 2] & 0xff;
    uVar32 = auStack_218[lVar10 + 3] & 0xff;
    uVar34 = auStack_218[lVar10 + 4] & 0xff;
    uVar35 = auStack_218[lVar10 + 5] & 0xff;
    uVar36 = auStack_218[lVar10 + 6] & 0xff;
    uVar37 = auStack_218[lVar10 + 7] & 0xff;
    cVar19 = (char)auStack_218[lVar10];
    cVar24 = (char)auStack_218[lVar10 + 1];
    auVar21[1] = (uVar26 != 0) * (uVar26 < 0x100) * cVar24 - (0xff < uVar26);
    auVar21[0] = (uVar20 != 0) * (uVar20 < 0x100) * cVar19 - (0xff < uVar20);
    cVar25 = (char)auStack_218[lVar10 + 2];
    auVar21[2] = (uVar29 != 0) * (uVar29 < 0x100) * cVar25 - (0xff < uVar29);
    cVar27 = (char)auStack_218[lVar10 + 3];
    auVar21[3] = (uVar32 != 0) * (uVar32 < 0x100) * cVar27 - (0xff < uVar32);
    cVar28 = (char)auStack_218[lVar10 + 4];
    auVar21[4] = (uVar34 != 0) * (uVar34 < 0x100) * cVar28 - (0xff < uVar34);
    cVar30 = (char)auStack_218[lVar10 + 5];
    auVar21[5] = (uVar35 != 0) * (uVar35 < 0x100) * cVar30 - (0xff < uVar35);
    cVar31 = (char)auStack_218[lVar10 + 6];
    auVar21[6] = (uVar36 != 0) * (uVar36 < 0x100) * cVar31 - (0xff < uVar36);
    cVar33 = (char)auStack_218[lVar10 + 7];
    auVar21[7] = (uVar37 != 0) * (uVar37 < 0x100) * cVar33 - (0xff < uVar37);
    auVar21[8] = (uVar20 != 0) * (uVar20 < 0x100) * cVar19 - (0xff < uVar20);
    auVar21[9] = (uVar26 != 0) * (uVar26 < 0x100) * cVar24 - (0xff < uVar26);
    auVar21[10] = (uVar29 != 0) * (uVar29 < 0x100) * cVar25 - (0xff < uVar29);
    auVar21[0xb] = (uVar32 != 0) * (uVar32 < 0x100) * cVar27 - (0xff < uVar32);
    auVar21[0xc] = (uVar34 != 0) * (uVar34 < 0x100) * cVar28 - (0xff < uVar34);
    auVar21[0xd] = (uVar35 != 0) * (uVar35 < 0x100) * cVar30 - (0xff < uVar35);
    auVar21[0xe] = (uVar36 != 0) * (uVar36 < 0x100) * cVar31 - (0xff < uVar36);
    auVar21[0xf] = (uVar37 != 0) * (uVar37 < 0x100) * cVar33 - (0xff < uVar37);
    auVar21 = psllw(auVar21,5);
    auVar21 = auVar21 & ZEXT816(0xe0e0e0e0e0e0e0e0);
    cVar19 = auVar21[0];
    auVar38[0] = -(cVar19 < '\0');
    cVar24 = auVar21[1];
    auVar38[1] = -(cVar24 < '\0');
    cVar25 = auVar21[2];
    auVar38[2] = -(cVar25 < '\0');
    cVar27 = auVar21[3];
    auVar38[3] = -(cVar27 < '\0');
    cVar28 = auVar21[4];
    auVar38[4] = -(cVar28 < '\0');
    cVar30 = auVar21[5];
    auVar38[5] = -(cVar30 < '\0');
    cVar31 = auVar21[6];
    auVar38[6] = -(cVar31 < '\0');
    cVar33 = auVar21[7];
    auVar38[7] = -(cVar33 < '\0');
    auVar38[8] = -(auVar21[8] < '\0');
    auVar38[9] = -(auVar21[9] < '\0');
    auVar38[10] = -(auVar21[10] < '\0');
    auVar38[0xb] = -(auVar21[0xb] < '\0');
    auVar38[0xc] = -(auVar21[0xc] < '\0');
    auVar38[0xd] = -(auVar21[0xd] < '\0');
    auVar38[0xe] = -(auVar21[0xe] < '\0');
    auVar38[0xf] = -(auVar21[0xf] < '\0');
    auVar38 = auVar38 & ZEXT816(0x1010101010101010) | ~auVar38 & _DAT_001081d0;
    auVar40[0] = -((char)(cVar19 * '\x02') < '\0');
    auVar40[1] = -((char)(cVar24 * '\x02') < '\0');
    auVar40[2] = -((char)(cVar25 * '\x02') < '\0');
    auVar40[3] = -((char)(cVar27 * '\x02') < '\0');
    auVar40[4] = -((char)(cVar28 * '\x02') < '\0');
    auVar40[5] = -((char)(cVar30 * '\x02') < '\0');
    auVar40[6] = -((char)(cVar31 * '\x02') < '\0');
    auVar40[7] = -((char)(cVar33 * '\x02') < '\0');
    auVar40[8] = -((char)(auVar21[8] * '\x02') < '\0');
    auVar40[9] = -((char)(auVar21[9] * '\x02') < '\0');
    auVar40[10] = -((char)(auVar21[10] * '\x02') < '\0');
    auVar40[0xb] = -((char)(auVar21[0xb] * '\x02') < '\0');
    auVar40[0xc] = -((char)(auVar21[0xc] * '\x02') < '\0');
    auVar40[0xd] = -((char)(auVar21[0xd] * '\x02') < '\0');
    auVar40[0xe] = -((char)(auVar21[0xe] * '\x02') < '\0');
    auVar40[0xf] = -((char)(auVar21[0xf] * '\x02') < '\0');
    auVar21 = psllw(auVar38,2);
    auVar21 = auVar21 & auVar40 & _DAT_001081f0 | ~auVar40 & auVar38;
    uVar39 = CONCAT17(-((char)(cVar33 << 2) < '\0'),
                      CONCAT16(-((char)(cVar31 << 2) < '\0'),
                               CONCAT15(-((char)(cVar30 << 2) < '\0'),
                                        CONCAT14(-((char)(cVar28 << 2) < '\0'),
                                                 CONCAT13(-((char)(cVar27 << 2) < '\0'),
                                                          CONCAT12(-((char)(cVar25 << 2) < '\0'),
                                                                   CONCAT11(-((char)(cVar24 << 2) <
                                                                             '\0'),-((char)(cVar19 
                                                  << 2) < '\0'))))))));
    *(ulong *)((long)local_258 + lVar10) =
         CONCAT17(auVar21[7] * '\x02',
                  CONCAT16(auVar21[6] * '\x02',
                           CONCAT15(auVar21[5] * '\x02',
                                    CONCAT14(auVar21[4] * '\x02',
                                             CONCAT13(auVar21[3] * '\x02',
                                                      CONCAT12(auVar21[2] * '\x02',
                                                               CONCAT11(auVar21[1] * '\x02',
                                                                        auVar21[0] * '\x02'))))))) &
         uVar39 | ~uVar39 & auVar21._0_8_;
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x40);
  lVar10 = 0;
  do {
    e[lVar10] = '\0';
    auVar21 = pshuflw(ZEXT416((uint)lVar10),ZEXT416((uint)lVar10),0);
    uVar13 = auVar21._0_4_;
    auVar15._4_4_ = uVar13;
    auVar15._0_4_ = uVar13;
    auVar15._8_4_ = uVar13;
    auVar15._12_4_ = uVar13;
    lVar12 = 0;
    auVar21 = (undefined1  [16])0x0;
    do {
      auVar17._0_2_ = auStack_218[lVar12] >> 3;
      auVar17._2_2_ = auStack_218[lVar12 + 1] >> 3;
      auVar17._4_2_ = auStack_218[lVar12 + 2] >> 3;
      auVar17._6_2_ = auStack_218[lVar12 + 3] >> 3;
      auVar17._8_2_ = auStack_218[lVar12 + 4] >> 3;
      auVar17._10_2_ = auStack_218[lVar12 + 5] >> 3;
      auVar17._12_2_ = auStack_218[lVar12 + 6] >> 3;
      auVar17._14_2_ = auStack_218[lVar12 + 7] >> 3;
      auVar17 = auVar17 ^ auVar15;
      auVar2._10_2_ = 0;
      auVar2._0_10_ = auVar17._0_10_;
      auVar2._12_2_ = auVar17._6_2_;
      auVar3._8_2_ = auVar17._4_2_;
      auVar3._0_8_ = auVar17._0_8_;
      auVar3._10_4_ = auVar2._10_4_;
      auVar9._6_8_ = 0;
      auVar9._0_6_ = auVar3._8_6_;
      auVar4._4_2_ = auVar17._2_2_;
      auVar4._0_4_ = auVar17._0_4_;
      auVar4._6_8_ = SUB148(auVar9 << 0x40,6);
      auVar22._0_4_ = (int)(auVar17._8_2_ - 1) >> 0x1f;
      auVar22._4_4_ = (int)(auVar17._10_2_ - 1) >> 0x1f;
      auVar22._8_4_ = (int)(auVar17._12_2_ - 1) >> 0x1f;
      auVar22._12_4_ = (int)(auVar17._14_2_ - 1) >> 0x1f;
      auVar18._0_4_ = (int)((auVar17._0_4_ & 0xffff) - 1) >> 0x1f;
      auVar18._4_4_ = auVar4._4_4_ + -1 >> 0x1f;
      auVar18._8_4_ = auVar3._8_4_ + -1 >> 0x1f;
      auVar18._12_4_ = (int)((auVar2._10_4_ >> 0x10) - 1) >> 0x1f;
      auVar38 = packssdw(auVar18,auVar22);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)((long)local_258 + lVar12);
      auVar38 = packsswb(auVar38,auVar38);
      auVar21 = auVar21 | auVar38 & auVar23;
      lVar12 = lVar12 + 8;
    } while (lVar12 != 0x40);
    uVar13 = auVar21._4_4_;
    auVar16._4_4_ = uVar13;
    auVar16._0_4_ = uVar13;
    auVar16._8_4_ = uVar13;
    auVar16._12_4_ = uVar13;
    auVar16 = auVar16 | auVar21;
    auVar14._0_4_ = auVar16._0_4_ >> 0x10;
    auVar14._4_4_ = 0;
    auVar14._8_4_ = auVar16._8_4_ >> 0x10;
    auVar14._12_4_ = auVar16._12_4_ >> 0x10;
    e[lVar10] = SUB161(auVar14 | auVar16,1) | SUB161(auVar14 | auVar16,0);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x1b4);
  return;
}

Assistant:

void gen_e(unsigned char *e)
{
	int i, j, eq, count;

	uint16_t ind_[ SYS_T*2 ];
	uint16_t ind[ SYS_T*2 ];
	unsigned char mask;	
	unsigned char val[ SYS_T ];	

	while (1)
	{
		randombytes((unsigned char *) ind_, sizeof(ind_));

		for (i = 0; i < SYS_T*2; i++)
			ind_[i] &= GFMASK;

		// moving and counting indices in the correct range

		count = 0;
		for (i = 0; i < SYS_T*2; i++)
			if (ind_[i] < SYS_N)
				ind[ count++ ] = ind_[i];
		
		if (count < SYS_T) continue;

		// check for repetition

		eq = 0;

		for (i = 1; i < SYS_T; i++) for (j = 0; j < i; j++)
			if (ind[i] == ind[j]) 
				eq = 1;

		if (eq == 0)
			break;
	}

	for (j = 0; j < SYS_T; j++)
		val[j] = 1 << (ind[j] & 7);

	for (i = 0; i < SYS_N/8; i++) 
	{
		e[i] = 0;

		for (j = 0; j < SYS_T; j++)
		{
			mask = same_mask(i, (ind[j] >> 3));

			e[i] |= val[j] & mask;
		}
	}
}